

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O2

void __thiscall
IntrusiveListTest_erase_range_Test::TestBody(IntrusiveListTest_erase_range_Test *this)

{
  TestObject *pTVar1;
  vector<int,_std::allocator<int>_> *data_values;
  vector<int,_std::allocator<int>_> *expected;
  difference_type __n;
  vector<int,_std::allocator<int>_> *expected_00;
  vector<int,_std::allocator<int>_> *expected_01;
  iterator iVar2;
  iterator iVar3;
  iterator first;
  iterator first_00;
  iterator last;
  iterator last_00;
  iterator last_01;
  iterator last_02;
  iterator __x;
  iterator __x_00;
  iterator __x_01;
  iterator __x_02;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  TestObjectList local_58;
  TestObjectList list;
  
  local_78 = 0x200000001;
  uStack_70 = 0x400000003;
  local_68 = 0x600000005;
  local_58.first_ = (TestObject *)0x0;
  local_58.last_ = (TestObject *)0x0;
  local_58.size_ = 0;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&local_58,&local_78);
  anon_unknown.dwarf_6c8ba::IntrusiveListTest::NewList
            (&list,(IntrusiveListTest *)&local_58,data_values);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_58);
  iVar2.node_ = list.first_;
  iVar2.list_ = &list;
  last.node_ = list.first_;
  last.list_ = &list;
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::erase(&list,iVar2,last);
  iVar3.node_ = (TestObject *)0x0;
  iVar3.list_ = &list;
  last_00.node_ = (TestObject *)0x0;
  last_00.list_ = &list;
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::erase(&list,iVar3,last_00);
  pTVar1 = list.first_;
  __x.node_ = list.first_;
  __x.list_ = &list;
  iVar2 = std::next<wabt::intrusive_list<(anonymous_namespace)::TestObject>::iterator>(__x,1);
  first.node_ = pTVar1;
  first.list_ = &list;
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::erase(&list,first,iVar2);
  local_78 = 0x300000002;
  uStack_70 = 0x500000004;
  local_68 = CONCAT44(local_68._4_4_,6);
  local_58.first_ = (TestObject *)0x0;
  local_58.last_ = (TestObject *)0x0;
  local_58.size_ = 0;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&local_58,&local_78,(long)&local_68 + 4);
  anon_unknown.dwarf_6c8ba::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)&list,&local_58,expected);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_58);
  __x_00.node_ = (TestObject *)0x0;
  __x_00.list_ = &list;
  iVar2 = std::prev<wabt::intrusive_list<(anonymous_namespace)::TestObject>::iterator>(__x_00,__n);
  last_01.node_ = (TestObject *)0x0;
  last_01.list_ = &list;
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::erase(&list,iVar2,last_01);
  local_78 = 0x300000002;
  uStack_70 = 0x500000004;
  local_58.first_ = (TestObject *)0x0;
  local_58.last_ = (TestObject *)0x0;
  local_58.size_ = 0;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&local_58,&local_78,&local_68);
  anon_unknown.dwarf_6c8ba::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)&list,&local_58,expected_00);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_58);
  __x_01.node_ = list.first_;
  __x_01.list_ = &list;
  iVar2 = std::next<wabt::intrusive_list<(anonymous_namespace)::TestObject>::iterator>(__x_01,1);
  __x_02.node_ = (TestObject *)0x0;
  __x_02.list_ = &list;
  iVar3 = std::prev<wabt::intrusive_list<(anonymous_namespace)::TestObject>::iterator>
                    (__x_02,(difference_type)iVar2.node_);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::erase(&list,iVar2,iVar3);
  local_78 = 0x500000002;
  local_58.first_ = (TestObject *)0x0;
  local_58.last_ = (TestObject *)0x0;
  local_58.size_ = 0;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&local_58,&local_78,&uStack_70);
  anon_unknown.dwarf_6c8ba::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)&list,&local_58,expected_01);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_58);
  first_00.node_ = list.first_;
  first_00.list_ = &list;
  last_02.node_ = (TestObject *)0x0;
  last_02.list_ = &list;
  iVar2 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::erase(&list,first_00,last_02);
  local_58.first_ = (TestObject *)0x0;
  local_58.last_ = (TestObject *)0x0;
  local_58.size_ = 0;
  anon_unknown.dwarf_6c8ba::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)&list,&local_58,(vector<int,_std::allocator<int>_> *)iVar2.node_);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_58);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::clear(&list);
  return;
}

Assistant:

TEST_F(IntrusiveListTest, erase_range) {
  TestObjectList list = NewList({1, 2, 3, 4, 5, 6});

  // OK to erase an empty range.
  list.erase(list.begin(), list.begin());
  list.erase(list.end(), list.end());

  // Erase the first element (1).
  list.erase(list.begin(), std::next(list.begin()));
  AssertListEq(list, {2, 3, 4, 5, 6});

  // Erase the last element (6).
  list.erase(std::prev(list.end()), list.end());
  AssertListEq(list, {2, 3, 4, 5});

  // Erase [3, 4] => [2, 5]
  list.erase(std::next(list.begin()), std::prev(list.end()));
  AssertListEq(list, {2, 5});

  // Erase the rest.
  list.erase(list.begin(), list.end());
  AssertListEq(list, {});
}